

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  unsigned_long *result_data_00;
  SelectionVector *lsel;
  SelectionVector *rsel;
  ValidityMask *count_00;
  UnifiedVectorFormat *in_RCX;
  VectorType in_DL;
  ulong in_RSI;
  ulong in_RDI;
  byte in_R8B;
  unsigned_long *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  unsigned_long *in_stack_ffffffffffffff28;
  unsigned_long *in_stack_ffffffffffffff30;
  UnifiedVectorFormat local_c8 [8];
  ValidityMask *in_stack_ffffffffffffff40;
  ValidityMask *in_stack_ffffffffffffff48;
  ValidityMask *in_stack_ffffffffffffff50;
  UnifiedVectorFormat local_80 [79];
  byte local_31;
  UnifiedVectorFormat *local_30;
  VectorType local_28;
  ulong local_20;
  ulong local_18;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_28 = in_DL;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_c8);
  duckdb::Vector::ToUnifiedFormat(local_18,local_30);
  duckdb::Vector::ToUnifiedFormat(local_20,local_30);
  duckdb::Vector::SetVectorType(local_28);
  result_data_00 = FlatVector::GetData<unsigned_long>((Vector *)0xe4531d);
  lsel = (SelectionVector *)UnifiedVectorFormat::GetData<unsigned_long>(local_80);
  rsel = (SelectionVector *)UnifiedVectorFormat::GetData<unsigned_long>(local_c8);
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff48;
  count_00 = FlatVector::Validity((Vector *)0xe453a2);
  ExecuteGenericLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,result_data_00,lsel,rsel,
             (idx_t)count_00,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff50,SUB81((ulong)this >> 0x38,0));
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}